

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<float>::TPZVec(TPZVec<float> *this,TPZVec<float> *rval)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_016490a8;
  uVar5 = rval->fNElements;
  this->fNElements = uVar5;
  lVar1 = rval->fNAlloc;
  if (lVar1 == 0) {
    uVar4 = 0;
    pfVar3 = (float *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
    this->fStore = pfVar3;
    pfVar2 = rval->fStore;
    if ((long)uVar5 < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pfVar3[uVar4] = pfVar2[uVar4];
    }
  }
  else {
    this->fStore = rval->fStore;
    this->fNAlloc = lVar1;
    rval->fStore = (float *)0x0;
    rval->fNAlloc = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}